

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolFree_SPGMR(SUNLinearSolver S)

{
  N_Vector *in_RDI;
  int k;
  int in_stack_ffffffffffffffec;
  int iVar1;
  
  if (in_RDI != (N_Vector *)0x0) {
    if (*in_RDI != (N_Vector)0x0) {
      if ((*in_RDI)[5].content != (void *)0x0) {
        N_VDestroy((N_Vector)0xeda19d);
        (*in_RDI)[5].content = (void *)0x0;
      }
      if ((*in_RDI)[5].sunctx != (SUNContext)0x0) {
        N_VDestroy((N_Vector)0xeda1d3);
        (*in_RDI)[5].sunctx = (SUNContext)0x0;
      }
      if ((*in_RDI)[4].content != (void *)0x0) {
        N_VDestroyVectorArray(in_RDI,in_stack_ffffffffffffffec);
        (*in_RDI)[4].content = (void *)0x0;
      }
      if ((*in_RDI)[4].ops != (N_Vector_Ops)0x0) {
        for (iVar1 = 0; iVar1 <= *(int *)&(*in_RDI)->content; iVar1 = iVar1 + 1) {
          if ((&((*in_RDI)[4].ops)->nvgetvectorid)[iVar1] != (_func_N_Vector_ID_N_Vector *)0x0) {
            free((&((*in_RDI)[4].ops)->nvgetvectorid)[iVar1]);
            (&((*in_RDI)[4].ops)->nvgetvectorid)[iVar1] = (_func_N_Vector_ID_N_Vector *)0x0;
          }
        }
        free((*in_RDI)[4].ops);
        (*in_RDI)[4].ops = (N_Vector_Ops)0x0;
      }
      if ((*in_RDI)[4].sunctx != (SUNContext)0x0) {
        free((*in_RDI)[4].sunctx);
        (*in_RDI)[4].sunctx = (SUNContext)0x0;
      }
      if ((*in_RDI)[5].ops != (N_Vector_Ops)0x0) {
        free((*in_RDI)[5].ops);
        (*in_RDI)[5].ops = (N_Vector_Ops)0x0;
      }
      if ((*in_RDI)[6].content != (void *)0x0) {
        free((*in_RDI)[6].content);
        (*in_RDI)[6].content = (void *)0x0;
      }
      if ((*in_RDI)[6].ops != (N_Vector_Ops)0x0) {
        free((*in_RDI)[6].ops);
        (*in_RDI)[6].ops = (N_Vector_Ops)0x0;
      }
      free(*in_RDI);
      *in_RDI = (N_Vector)0x0;
    }
    if (in_RDI[1] != (N_Vector)0x0) {
      free(in_RDI[1]);
      in_RDI[1] = (N_Vector)0x0;
    }
    free(in_RDI);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  if (S->content) {
    /* delete items from within the content structure */
    if (SPGMR_CONTENT(S)->xcor) {
      N_VDestroy(SPGMR_CONTENT(S)->xcor);
      SPGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPGMR_CONTENT(S)->vtemp) {
      N_VDestroy(SPGMR_CONTENT(S)->vtemp);
      SPGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPGMR_CONTENT(S)->V) {
      N_VDestroyVectorArray(SPGMR_CONTENT(S)->V,
                            SPGMR_CONTENT(S)->maxl+1);
      SPGMR_CONTENT(S)->V = NULL;
    }
    if (SPGMR_CONTENT(S)->Hes) {
      for (k=0; k<=SPGMR_CONTENT(S)->maxl; k++)
        if (SPGMR_CONTENT(S)->Hes[k]) {
          free(SPGMR_CONTENT(S)->Hes[k]);
          SPGMR_CONTENT(S)->Hes[k] = NULL;
        }
      free(SPGMR_CONTENT(S)->Hes);
      SPGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPGMR_CONTENT(S)->givens) {
      free(SPGMR_CONTENT(S)->givens);
      SPGMR_CONTENT(S)->givens = NULL;
    }
    if (SPGMR_CONTENT(S)->yg) {
      free(SPGMR_CONTENT(S)->yg);
      SPGMR_CONTENT(S)->yg = NULL;
    }
    if (SPGMR_CONTENT(S)->cv) {
      free(SPGMR_CONTENT(S)->cv);
      SPGMR_CONTENT(S)->cv = NULL;
    }
    if (SPGMR_CONTENT(S)->Xv) {
      free(SPGMR_CONTENT(S)->Xv);
      SPGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content); S->content = NULL;
  }
  if (S->ops) { free(S->ops); S->ops = NULL; }
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}